

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool gflags::ReadFromFlagsFile(string *filename,char *prog_name,bool errors_are_fatal)

{
  bool bVar1;
  undefined7 in_register_00000011;
  _anonymous_namespace_ *this;
  string local_30;
  
  this = (_anonymous_namespace_ *)(filename->_M_dataplus)._M_p;
  (anonymous_namespace)::ReadFileIntoString_abi_cxx11_
            (&local_30,this,(char *)CONCAT71(in_register_00000011,errors_are_fatal));
  bVar1 = ReadFlagsFromString(&local_30,(char *)this,errors_are_fatal);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool ReadFromFlagsFile(const string& filename, const char* prog_name,
                       bool errors_are_fatal) {
  return ReadFlagsFromString(ReadFileIntoString(filename.c_str()),
                             prog_name, errors_are_fatal);
}